

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# type-updating.cpp
# Opt level: O1

void __thiscall
wasm::GlobalTypeRewriter::mapTypes(std::unordered_map<wasm::HeapType,wasm::HeapType,std::hash<wasm::
HeapType>,std::equal_to<wasm::HeapType>,std::allocator<std::pair<wasm::HeapType_const,wasm::
HeapType>>>const&)::CodeUpdater::visitExpression(wasm::Expression__(void *this,Expression *curr)

{
  Id IVar1;
  Type TVar2;
  const_iterator cVar3;
  char *__function;
  key_type *pkVar4;
  key_type local_20;
  
  if (curr->_id == LocalSetId) {
    if ((curr->type).id < 2) {
      return;
    }
LAB_00ab2b23:
    TVar2 = Function::getLocalType(*(Function **)((long)this + 0xf8),curr[1]._id);
    (curr->type).id = TVar2.id;
    return;
  }
  if (curr->_id == LocalGetId) goto LAB_00ab2b23;
  TVar2 = getNew(wasm::Type_(this,(curr->type).id);
  (curr->type).id = TVar2.id;
  IVar1 = curr->_id;
  switch(IVar1) {
  case InvalidId:
  case NumExpressionIds:
    handle_unreachable("unexpected expression type",
                       "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/src/wasm-delegations-fields.def"
                       ,0xb0);
  case BlockId:
    if (IVar1 != BlockId) {
      __function = "T *wasm::Expression::cast() [T = wasm::Block]";
LAB_00ab373a:
      __assert_fail("int(_id) == int(T::SpecificId)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/src/wasm.h"
                    ,0x314,__function);
    }
    break;
  case IfId:
    if (IVar1 != IfId) {
      __function = "T *wasm::Expression::cast() [T = wasm::If]";
      goto LAB_00ab373a;
    }
    break;
  case LoopId:
    if (IVar1 != LoopId) {
      __function = "T *wasm::Expression::cast() [T = wasm::Loop]";
      goto LAB_00ab373a;
    }
    break;
  case BreakId:
    if (IVar1 != BreakId) {
      __function = "T *wasm::Expression::cast() [T = wasm::Break]";
      goto LAB_00ab373a;
    }
    break;
  case SwitchId:
    if (IVar1 != SwitchId) {
      __function = "T *wasm::Expression::cast() [T = wasm::Switch]";
      goto LAB_00ab373a;
    }
    break;
  case CallId:
    if (IVar1 != CallId) {
      __function = "T *wasm::Expression::cast() [T = wasm::Call]";
      goto LAB_00ab373a;
    }
    break;
  case CallIndirectId:
    if (IVar1 != CallIndirectId) {
      __function = "T *wasm::Expression::cast() [T = wasm::CallIndirect]";
      goto LAB_00ab373a;
    }
    local_20.id = *(uintptr_t *)(curr + 1);
    if (0xd < local_20.id) {
      cVar3 = std::
              _Hashtable<wasm::HeapType,_std::pair<const_wasm::HeapType,_wasm::HeapType>,_std::allocator<std::pair<const_wasm::HeapType,_wasm::HeapType>_>,_std::__detail::_Select1st,_std::equal_to<wasm::HeapType>,_std::hash<wasm::HeapType>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
              ::find(*(_Hashtable<wasm::HeapType,_std::pair<const_wasm::HeapType,_wasm::HeapType>,_std::allocator<std::pair<const_wasm::HeapType,_wasm::HeapType>_>,_std::__detail::_Select1st,_std::equal_to<wasm::HeapType>,_std::hash<wasm::HeapType>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                       **)((long)this + 0x108),&local_20);
      pkVar4 = (key_type *)
               ((long)cVar3.
                      super__Node_iterator_base<std::pair<const_wasm::HeapType,_wasm::HeapType>,_true>
                      ._M_cur + 0x10);
      if (cVar3.super__Node_iterator_base<std::pair<const_wasm::HeapType,_wasm::HeapType>,_true>.
          _M_cur == (__node_type *)0x0) {
        pkVar4 = &local_20;
      }
      local_20.id = pkVar4->id;
    }
    goto LAB_00ab3324;
  case LocalGetId:
    if (IVar1 != LocalGetId) {
      __function = "T *wasm::Expression::cast() [T = wasm::LocalGet]";
      goto LAB_00ab373a;
    }
    break;
  case LocalSetId:
    if (IVar1 != LocalSetId) {
      __function = "T *wasm::Expression::cast() [T = wasm::LocalSet]";
      goto LAB_00ab373a;
    }
    break;
  case GlobalGetId:
    if (IVar1 != GlobalGetId) {
      __function = "T *wasm::Expression::cast() [T = wasm::GlobalGet]";
      goto LAB_00ab373a;
    }
    break;
  case GlobalSetId:
    if (IVar1 != GlobalSetId) {
      __function = "T *wasm::Expression::cast() [T = wasm::GlobalSet]";
      goto LAB_00ab373a;
    }
    break;
  case LoadId:
    if (IVar1 != LoadId) {
      __function = "T *wasm::Expression::cast() [T = wasm::Load]";
      goto LAB_00ab373a;
    }
    break;
  case StoreId:
    if (IVar1 != StoreId) {
      __function = "T *wasm::Expression::cast() [T = wasm::Store]";
      goto LAB_00ab373a;
    }
    TVar2 = getNew(wasm::Type_(this,*(uintptr_t *)(curr + 4));
    *(uintptr_t *)(curr + 4) = TVar2.id;
    break;
  case ConstId:
    if (IVar1 != ConstId) {
      __function = "T *wasm::Expression::cast() [T = wasm::Const]";
      goto LAB_00ab373a;
    }
    break;
  case UnaryId:
    if (IVar1 != UnaryId) {
      __function = "T *wasm::Expression::cast() [T = wasm::Unary]";
      goto LAB_00ab373a;
    }
    break;
  case BinaryId:
    if (IVar1 != BinaryId) {
      __function = "T *wasm::Expression::cast() [T = wasm::Binary]";
      goto LAB_00ab373a;
    }
    break;
  case SelectId:
    if (IVar1 != SelectId) {
      __function = "T *wasm::Expression::cast() [T = wasm::Select]";
      goto LAB_00ab373a;
    }
    break;
  case DropId:
    if (IVar1 != DropId) {
      __function = "T *wasm::Expression::cast() [T = wasm::Drop]";
      goto LAB_00ab373a;
    }
    break;
  case ReturnId:
    if (IVar1 != ReturnId) {
      __function = "T *wasm::Expression::cast() [T = wasm::Return]";
      goto LAB_00ab373a;
    }
    break;
  case MemorySizeId:
    if (IVar1 != MemorySizeId) {
      __function = "T *wasm::Expression::cast() [T = wasm::MemorySize]";
      goto LAB_00ab373a;
    }
    local_20.id = (uintptr_t)getNew(wasm::Type_(this,*(uintptr_t *)(curr + 1));
LAB_00ab3324:
    *(uintptr_t *)(curr + 1) = local_20.id;
    break;
  case MemoryGrowId:
    if (IVar1 != MemoryGrowId) {
      __function = "T *wasm::Expression::cast() [T = wasm::MemoryGrow]";
      goto LAB_00ab373a;
    }
    goto LAB_00ab3633;
  case NopId:
    if (IVar1 != NopId) {
      __function = "T *wasm::Expression::cast() [T = wasm::Nop]";
      goto LAB_00ab373a;
    }
    break;
  case UnreachableId:
    if (IVar1 != UnreachableId) {
      __function = "T *wasm::Expression::cast() [T = wasm::Unreachable]";
      goto LAB_00ab373a;
    }
    break;
  case AtomicRMWId:
    if (IVar1 != AtomicRMWId) {
      __function = "T *wasm::Expression::cast() [T = wasm::AtomicRMW]";
      goto LAB_00ab373a;
    }
    break;
  case AtomicCmpxchgId:
    if (IVar1 != AtomicCmpxchgId) {
      __function = "T *wasm::Expression::cast() [T = wasm::AtomicCmpxchg]";
      goto LAB_00ab373a;
    }
    break;
  case AtomicWaitId:
    if (IVar1 != AtomicWaitId) {
      __function = "T *wasm::Expression::cast() [T = wasm::AtomicWait]";
      goto LAB_00ab373a;
    }
    goto LAB_00ab2ec6;
  case AtomicNotifyId:
    if (IVar1 != AtomicNotifyId) {
      __function = "T *wasm::Expression::cast() [T = wasm::AtomicNotify]";
      goto LAB_00ab373a;
    }
    break;
  case AtomicFenceId:
    if (IVar1 != AtomicFenceId) {
      __function = "T *wasm::Expression::cast() [T = wasm::AtomicFence]";
      goto LAB_00ab373a;
    }
    break;
  case SIMDExtractId:
    if (IVar1 != SIMDExtractId) {
      __function = "T *wasm::Expression::cast() [T = wasm::SIMDExtract]";
      goto LAB_00ab373a;
    }
    break;
  case SIMDReplaceId:
    if (IVar1 != SIMDReplaceId) {
      __function = "T *wasm::Expression::cast() [T = wasm::SIMDReplace]";
      goto LAB_00ab373a;
    }
    break;
  case SIMDShuffleId:
    if (IVar1 != SIMDShuffleId) {
      __function = "T *wasm::Expression::cast() [T = wasm::SIMDShuffle]";
      goto LAB_00ab373a;
    }
    break;
  case SIMDTernaryId:
    if (IVar1 != SIMDTernaryId) {
      __function = "T *wasm::Expression::cast() [T = wasm::SIMDTernary]";
      goto LAB_00ab373a;
    }
    break;
  case SIMDShiftId:
    if (IVar1 != SIMDShiftId) {
      __function = "T *wasm::Expression::cast() [T = wasm::SIMDShift]";
      goto LAB_00ab373a;
    }
    break;
  case SIMDLoadId:
    if (IVar1 != SIMDLoadId) {
      __function = "T *wasm::Expression::cast() [T = wasm::SIMDLoad]";
      goto LAB_00ab373a;
    }
    break;
  case SIMDLoadStoreLaneId:
    if (IVar1 != SIMDLoadStoreLaneId) {
      __function = "T *wasm::Expression::cast() [T = wasm::SIMDLoadStoreLane]";
      goto LAB_00ab373a;
    }
    break;
  case MemoryInitId:
    if (IVar1 != MemoryInitId) {
      __function = "T *wasm::Expression::cast() [T = wasm::MemoryInit]";
      goto LAB_00ab373a;
    }
    break;
  case DataDropId:
    if (IVar1 != DataDropId) {
      __function = "T *wasm::Expression::cast() [T = wasm::DataDrop]";
      goto LAB_00ab373a;
    }
    break;
  case MemoryCopyId:
    if (IVar1 != MemoryCopyId) {
      __function = "T *wasm::Expression::cast() [T = wasm::MemoryCopy]";
      goto LAB_00ab373a;
    }
    break;
  case MemoryFillId:
    if (IVar1 != MemoryFillId) {
      __function = "T *wasm::Expression::cast() [T = wasm::MemoryFill]";
      goto LAB_00ab373a;
    }
    break;
  case PopId:
    if (IVar1 != PopId) {
      __function = "T *wasm::Expression::cast() [T = wasm::Pop]";
      goto LAB_00ab373a;
    }
    break;
  case RefNullId:
    if (IVar1 != RefNullId) {
      __function = "T *wasm::Expression::cast() [T = wasm::RefNull]";
      goto LAB_00ab373a;
    }
    break;
  case RefIsNullId:
    if (IVar1 != RefIsNullId) {
      __function = "T *wasm::Expression::cast() [T = wasm::RefIsNull]";
      goto LAB_00ab373a;
    }
    break;
  case RefFuncId:
    if (IVar1 != RefFuncId) {
      __function = "T *wasm::Expression::cast() [T = wasm::RefFunc]";
      goto LAB_00ab373a;
    }
    break;
  case RefEqId:
    if (IVar1 != RefEqId) {
      __function = "T *wasm::Expression::cast() [T = wasm::RefEq]";
      goto LAB_00ab373a;
    }
    break;
  case TableGetId:
    if (IVar1 != TableGetId) {
      __function = "T *wasm::Expression::cast() [T = wasm::TableGet]";
      goto LAB_00ab373a;
    }
    break;
  case TableSetId:
    if (IVar1 != TableSetId) {
      __function = "T *wasm::Expression::cast() [T = wasm::TableSet]";
      goto LAB_00ab373a;
    }
    break;
  case TableSizeId:
    if (IVar1 != TableSizeId) {
      __function = "T *wasm::Expression::cast() [T = wasm::TableSize]";
      goto LAB_00ab373a;
    }
    break;
  case TableGrowId:
    if (IVar1 != TableGrowId) {
      __function = "T *wasm::Expression::cast() [T = wasm::TableGrow]";
      goto LAB_00ab373a;
    }
    break;
  case TryId:
    if (IVar1 != TryId) {
      __function = "T *wasm::Expression::cast() [T = wasm::Try]";
      goto LAB_00ab373a;
    }
    break;
  case ThrowId:
    if (IVar1 != ThrowId) {
      __function = "T *wasm::Expression::cast() [T = wasm::Throw]";
      goto LAB_00ab373a;
    }
    break;
  case RethrowId:
    if (IVar1 != RethrowId) {
      __function = "T *wasm::Expression::cast() [T = wasm::Rethrow]";
      goto LAB_00ab373a;
    }
    break;
  case TupleMakeId:
    if (IVar1 != TupleMakeId) {
      __function = "T *wasm::Expression::cast() [T = wasm::TupleMake]";
      goto LAB_00ab373a;
    }
    break;
  case TupleExtractId:
    if (IVar1 != TupleExtractId) {
      __function = "T *wasm::Expression::cast() [T = wasm::TupleExtract]";
      goto LAB_00ab373a;
    }
    break;
  case I31NewId:
    if (IVar1 != I31NewId) {
      __function = "T *wasm::Expression::cast() [T = wasm::I31New]";
      goto LAB_00ab373a;
    }
    break;
  case I31GetId:
    if (IVar1 != I31GetId) {
      __function = "T *wasm::Expression::cast() [T = wasm::I31Get]";
      goto LAB_00ab373a;
    }
    break;
  case CallRefId:
    if (IVar1 != CallRefId) {
      __function = "T *wasm::Expression::cast() [T = wasm::CallRef]";
      goto LAB_00ab373a;
    }
    break;
  case RefTestId:
    if (IVar1 != RefTestId) {
      __function = "T *wasm::Expression::cast() [T = wasm::RefTest]";
      goto LAB_00ab373a;
    }
LAB_00ab3633:
    TVar2 = getNew(wasm::Type_(this,curr[1].type.id);
    curr[1].type.id = TVar2.id;
    break;
  case RefCastId:
    if (IVar1 != RefCastId) {
      __function = "T *wasm::Expression::cast() [T = wasm::RefCast]";
      goto LAB_00ab373a;
    }
    break;
  case BrOnId:
    if (IVar1 != BrOnId) {
      __function = "T *wasm::Expression::cast() [T = wasm::BrOn]";
      goto LAB_00ab373a;
    }
LAB_00ab2ec6:
    TVar2 = getNew(wasm::Type_(this,*(uintptr_t *)(curr + 3));
    *(uintptr_t *)(curr + 3) = TVar2.id;
    break;
  case StructNewId:
    if (IVar1 != StructNewId) {
      __function = "T *wasm::Expression::cast() [T = wasm::StructNew]";
      goto LAB_00ab373a;
    }
    break;
  case StructGetId:
    if (IVar1 != StructGetId) {
      __function = "T *wasm::Expression::cast() [T = wasm::StructGet]";
      goto LAB_00ab373a;
    }
    break;
  case StructSetId:
    if (IVar1 != StructSetId) {
      __function = "T *wasm::Expression::cast() [T = wasm::StructSet]";
      goto LAB_00ab373a;
    }
    break;
  case ArrayNewId:
    if (IVar1 != ArrayNewId) {
      __function = "T *wasm::Expression::cast() [T = wasm::ArrayNew]";
      goto LAB_00ab373a;
    }
    break;
  case ArrayNewSegId:
    if (IVar1 != ArrayNewSegId) {
      __function = "T *wasm::Expression::cast() [T = wasm::ArrayNewSeg]";
      goto LAB_00ab373a;
    }
    break;
  case ArrayNewFixedId:
    if (IVar1 != ArrayNewFixedId) {
      __function = "T *wasm::Expression::cast() [T = wasm::ArrayNewFixed]";
      goto LAB_00ab373a;
    }
    break;
  case ArrayGetId:
    if (IVar1 != ArrayGetId) {
      __function = "T *wasm::Expression::cast() [T = wasm::ArrayGet]";
      goto LAB_00ab373a;
    }
    break;
  case ArraySetId:
    if (IVar1 != ArraySetId) {
      __function = "T *wasm::Expression::cast() [T = wasm::ArraySet]";
      goto LAB_00ab373a;
    }
    break;
  case ArrayLenId:
    if (IVar1 != ArrayLenId) {
      __function = "T *wasm::Expression::cast() [T = wasm::ArrayLen]";
      goto LAB_00ab373a;
    }
    break;
  case ArrayCopyId:
    if (IVar1 != ArrayCopyId) {
      __function = "T *wasm::Expression::cast() [T = wasm::ArrayCopy]";
      goto LAB_00ab373a;
    }
    break;
  case ArrayFillId:
    if (IVar1 != ArrayFillId) {
      __function = "T *wasm::Expression::cast() [T = wasm::ArrayFill]";
      goto LAB_00ab373a;
    }
    break;
  case ArrayInitId:
    if (IVar1 != ArrayInitId) {
      __function = "T *wasm::Expression::cast() [T = wasm::ArrayInit]";
      goto LAB_00ab373a;
    }
    break;
  case RefAsId:
    if (IVar1 != RefAsId) {
      __function = "T *wasm::Expression::cast() [T = wasm::RefAs]";
      goto LAB_00ab373a;
    }
    break;
  case StringNewId:
    if (IVar1 != StringNewId) {
      __function = "T *wasm::Expression::cast() [T = wasm::StringNew]";
      goto LAB_00ab373a;
    }
    break;
  case StringConstId:
    if (IVar1 != StringConstId) {
      __function = "T *wasm::Expression::cast() [T = wasm::StringConst]";
      goto LAB_00ab373a;
    }
    break;
  case StringMeasureId:
    if (IVar1 != StringMeasureId) {
      __function = "T *wasm::Expression::cast() [T = wasm::StringMeasure]";
      goto LAB_00ab373a;
    }
    break;
  case StringEncodeId:
    if (IVar1 != StringEncodeId) {
      __function = "T *wasm::Expression::cast() [T = wasm::StringEncode]";
      goto LAB_00ab373a;
    }
    break;
  case StringConcatId:
    if (IVar1 != StringConcatId) {
      __function = "T *wasm::Expression::cast() [T = wasm::StringConcat]";
      goto LAB_00ab373a;
    }
    break;
  case StringEqId:
    if (IVar1 != StringEqId) {
      __function = "T *wasm::Expression::cast() [T = wasm::StringEq]";
      goto LAB_00ab373a;
    }
    break;
  case StringAsId:
    if (IVar1 != StringAsId) {
      __function = "T *wasm::Expression::cast() [T = wasm::StringAs]";
      goto LAB_00ab373a;
    }
    break;
  case StringWTF8AdvanceId:
    if (IVar1 != StringWTF8AdvanceId) {
      __function = "T *wasm::Expression::cast() [T = wasm::StringWTF8Advance]";
      goto LAB_00ab373a;
    }
    break;
  case StringWTF16GetId:
    if (IVar1 != StringWTF16GetId) {
      __function = "T *wasm::Expression::cast() [T = wasm::StringWTF16Get]";
      goto LAB_00ab373a;
    }
    break;
  case StringIterNextId:
    if (IVar1 != StringIterNextId) {
      __function = "T *wasm::Expression::cast() [T = wasm::StringIterNext]";
      goto LAB_00ab373a;
    }
    break;
  case StringIterMoveId:
    if (IVar1 != StringIterMoveId) {
      __function = "T *wasm::Expression::cast() [T = wasm::StringIterMove]";
      goto LAB_00ab373a;
    }
    break;
  case StringSliceWTFId:
    if (IVar1 != StringSliceWTFId) {
      __function = "T *wasm::Expression::cast() [T = wasm::StringSliceWTF]";
      goto LAB_00ab373a;
    }
    break;
  case StringSliceIterId:
    if (IVar1 != StringSliceIterId) {
      __function = "T *wasm::Expression::cast() [T = wasm::StringSliceIter]";
      goto LAB_00ab373a;
    }
  }
  return;
}

Assistant:

void visitExpression(Expression* curr) {
      // local.get and local.tee are special in that their type is tied to the
      // type of the local in the function, which is tied to the signature. That
      // means we must update it based on the signature, and not on the old type
      // in the local.
      //
      // We have already updated function signatures by the time we get here,
      // which means we can just apply the current local type that we see (there
      // is no need to call getNew(), which we already did on the function's
      // signature itself).
      if (auto* get = curr->dynCast<LocalGet>()) {
        curr->type = getFunction()->getLocalType(get->index);
        return;
      } else if (auto* tee = curr->dynCast<LocalSet>()) {
        // Rule out a local.set and unreachable code.
        if (tee->type != Type::none && tee->type != Type::unreachable) {
          curr->type = getFunction()->getLocalType(tee->index);
        }
        return;
      }

      // Update the type to the new one.
      curr->type = getNew(curr->type);

      // Update any other type fields as well.

#define DELEGATE_ID curr->_id

#define DELEGATE_START(id) [[maybe_unused]] auto* cast = curr->cast<id>();

#define DELEGATE_GET_FIELD(id, field) cast->field

#define DELEGATE_FIELD_TYPE(id, field) cast->field = getNew(cast->field);

#define DELEGATE_FIELD_HEAPTYPE(id, field) cast->field = getNew(cast->field);

#define DELEGATE_FIELD_CHILD(id, field)
#define DELEGATE_FIELD_OPTIONAL_CHILD(id, field)
#define DELEGATE_FIELD_INT(id, field)
#define DELEGATE_FIELD_INT_ARRAY(id, field)
#define DELEGATE_FIELD_LITERAL(id, field)
#define DELEGATE_FIELD_NAME(id, field)
#define DELEGATE_FIELD_NAME_VECTOR(id, field)
#define DELEGATE_FIELD_SCOPE_NAME_DEF(id, field)
#define DELEGATE_FIELD_SCOPE_NAME_USE(id, field)
#define DELEGATE_FIELD_SCOPE_NAME_USE_VECTOR(id, field)
#define DELEGATE_FIELD_ADDRESS(id, field)

#include "wasm-delegations-fields.def"
    }